

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O2

int stirling2_value(int n,int m)

{
  int *piVar1;
  ulong uVar2;
  ulong uVar3;
  int *piVar4;
  ulong uVar5;
  int *piVar6;
  int iVar7;
  
  uVar2 = (ulong)(uint)m;
  uVar3 = 0xffffffffffffffff;
  if (-1 < m * n) {
    uVar3 = (ulong)(uint)(m * n) * 4;
  }
  piVar1 = (int *)operator_new__(uVar3);
  iVar7 = 0;
  if (0 < m && 0 < n) {
    *piVar1 = 1;
    uVar3 = uVar2 + 1;
    piVar4 = piVar1;
    while (piVar4 = piVar4 + (uint)n, uVar2 = uVar2 - 1, uVar2 != 0) {
      *piVar4 = 0;
    }
    piVar4 = piVar1;
    for (uVar2 = 2; uVar2 != n + 1; uVar2 = uVar2 + 1) {
      piVar1[uVar2 - 1] = 1;
      piVar6 = piVar4;
      for (uVar5 = 2; uVar3 != uVar5; uVar5 = uVar5 + 1) {
        piVar6[(ulong)(uint)n + 1] = piVar6[(uint)n] * (int)uVar5 + *piVar6;
        piVar6 = piVar6 + (uint)n;
      }
      piVar4 = piVar4 + 1;
    }
    iVar7 = piVar1[(n + (m + -1) * n) - 1];
    operator_delete__(piVar1);
  }
  return iVar7;
}

Assistant:

int stirling2_value ( int n, int m )

//****************************************************************************80
//
//  Purpose:
//
//    STIRLING2_VALUE computes a Stirling number of the second kind.
//
//  Discussion:
//
//    S2(N,M) represents the number of distinct partitions of N elements
//    into M nonempty sets.  For a fixed N, the sum of the Stirling
//    numbers S2(N,M) is represented by B(N), called "Bell's number",
//    and represents the number of distinct partitions of N elements.
//
//    For example, with 4 objects, there are:
//
//    1 partition into 1 set:
//
//      (A,B,C,D)
//
//    7 partitions into 2 sets:
//
//      (A,B,C) (D)
//      (A,B,D) (C)
//      (A,C,D) (B)
//      (A) (B,C,D)
//      (A,B) (C,D)
//      (A,C) (B,D)
//      (A,D) (B,C)
//
//    6 partitions into 3 sets:
//
//      (A,B) (C) (D)
//      (A) (B,C) (D)
//      (A) (B) (C,D)
//      (A,C) (B) (D)
//      (A,D) (B) (C)
//      (A) (B,D) (C)
//
//    1 partition into 4 sets:
//
//      (A) (B) (C) (D)
//
//    So S2(4,1) = 1, S2(4,2) = 7, S2(4,3) = 6, S2(4,4) = 1, and B(4) = 15.
//
//
//  First terms:
//
//    N/M: 1    2    3    4    5    6    7    8
//
//    1    1    0    0    0    0    0    0    0
//    2    1    1    0    0    0    0    0    0
//    3    1    3    1    0    0    0    0    0
//    4    1    7    6    1    0    0    0    0
//    5    1   15   25   10    1    0    0    0
//    6    1   31   90   65   15    1    0    0
//    7    1   63  301  350  140   21    1    0
//    8    1  127  966 1701 1050  266   28    1
//
//  Recursion:
//
//    S2(N,1) = 1 for all N.
//    S2(I,I) = 1 for all I.
//    S2(I,J) = 0 if I < J.
//
//    S2(N,M) = M * S2(N-1,M) + S2(N-1,M-1)
//
//  Properties:
//
//    sum ( 1 <= K <= M ) S2(I,K) * S1(K,J) = Delta(I,J)
//
//    X^N = sum ( 0 <= K <= N ) S2(N,K) X_K
//    where X_K is the falling factorial function.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    25 August 2004
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int N, the number of rows of the table.
//
//    Input, int M, the number of columns of the table.
//
//    Output, int STIRLING2_VALUE, the value of S2(N,M).
//
{
  int i;
  int j;
  int *s2;
  int value;

  s2 = new int[n*m];

  if ( n <= 0 )
  {
    value = 0;
    return value;
  }

  if ( m <= 0 )
  {
    value = 0;
    return value;
  }

  s2[0+0*n] = 1;
  for ( j = 2; j <= m; j++ )
  {
    s2[0+(j-1)*n] = 0;
  }

  for ( i = 2; i <= n; i++ )
  {
    s2[i-1+0*n] = 1;
    for ( j = 2; j <= m; j++ )
    {
      s2[i-1+(j-1)*n] = j * s2[i-2+(j-1)*n] + s2[i-2+(j-2)*n];
    }
  }

  value = s2[n-1+(m-1)*n];

  delete [] s2;

  return value;
}